

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

VkClearValue vkt::synchronization::anon_unknown_0::makeClearValue(VkFormat format)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  VkClearValue VVar4;
  
  bVar1 = ::vk::isDepthStencilFormat(format);
  if (bVar1) {
    uVar2 = 0x153ecccccd;
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = ::vk::isIntFormat(format);
    if (bVar1) {
      uVar3 = 0x2000000018;
      uVar2 = 0x1000000008;
    }
    else {
      bVar1 = ::vk::isUintFormat(format);
      uVar3 = 0x3f8000003f400000;
      if (bVar1) {
        uVar3 = 0x2000000018;
      }
      uVar2 = 0x3efae1483e800000;
      if (bVar1) {
        uVar2 = 0x1000000008;
      }
    }
  }
  VVar4._8_8_ = uVar3;
  VVar4._0_4_ = (float)(int)uVar2;
  VVar4._4_4_ = (int)((ulong)uVar2 >> 0x20);
  return VVar4;
}

Assistant:

VkClearValue makeClearValue (const VkFormat format)
{
	if (isDepthStencilFormat(format))
		return makeClearValueDepthStencil(0.4f, 21u);
	else
	{
		if (isIntFormat(format) || isUintFormat(format))
			return makeClearValueColorU32(8u, 16u, 24u, 32u);
		else
			return makeClearValueColorF32(0.25f, 0.49f, 0.75f, 1.0f);
	}
}